

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

ly_bool lyxp_set_scnode_contains
                  (lyxp_set *set,lysc_node *node,lyxp_node_type node_type,int skip_idx,
                  uint32_t *index_p)

{
  uint local_34;
  uint32_t i;
  uint32_t *index_p_local;
  int skip_idx_local;
  lyxp_node_type node_type_local;
  lysc_node *node_local;
  lyxp_set *set_local;
  
  local_34 = 0;
  while( true ) {
    if (set->used <= local_34) {
      return '\0';
    }
    if ((((skip_idx < 0) || (local_34 != skip_idx)) &&
        (*(lysc_node **)((long)(set->val).nodes + (ulong)local_34 * 0x18) == node)) &&
       (*(lyxp_node_type *)((long)(set->val).nodes + (ulong)local_34 * 0x18 + 8) == node_type))
    break;
    local_34 = local_34 + 1;
  }
  if (index_p != (uint32_t *)0x0) {
    *index_p = local_34;
  }
  return '\x01';
}

Assistant:

ly_bool
lyxp_set_scnode_contains(struct lyxp_set *set, const struct lysc_node *node, enum lyxp_node_type node_type, int skip_idx,
        uint32_t *index_p)
{
    uint32_t i;

    for (i = 0; i < set->used; ++i) {
        if ((skip_idx > -1) && (i == (unsigned)skip_idx)) {
            continue;
        }

        if ((set->val.scnodes[i].scnode == node) && (set->val.scnodes[i].type == node_type)) {
            if (index_p) {
                *index_p = i;
            }
            return 1;
        }
    }

    return 0;
}